

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

PClassActor * ClassForSpawn(FName *classname)

{
  bool bVar1;
  char *pcVar2;
  FName local_1c;
  PClassActor *local_18;
  PClass *cls;
  FName *classname_local;
  
  cls = (PClass *)classname;
  FName::FName(&local_1c,classname);
  local_18 = (PClassActor *)PClass::FindClass(&local_1c);
  if (local_18 == (PClassActor *)0x0) {
    pcVar2 = FName::GetChars(classname);
    I_Error("Attempt to spawn actor of unknown type \'%s\'\n",pcVar2);
  }
  bVar1 = DObject::IsKindOf((DObject *)local_18,PClassActor::RegistrationInfo.MyClass);
  if (!bVar1) {
    pcVar2 = FName::GetChars(classname);
    I_Error("Attempt to spawn non-actor of type \'%s\'\n",pcVar2);
  }
  return local_18;
}

Assistant:

PClassActor *ClassForSpawn(FName classname)
{
	PClass *cls = PClass::FindClass(classname);
	if (cls == NULL)
	{
		I_Error("Attempt to spawn actor of unknown type '%s'\n", classname.GetChars());
	}
	if (!cls->IsKindOf(RUNTIME_CLASS(PClassActor)))
	{
		I_Error("Attempt to spawn non-actor of type '%s'\n", classname.GetChars());
	}
	return static_cast<PClassActor*>(cls);
}